

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.h
# Opt level: O3

void __thiscall sptk::StatisticsAccumulation::Buffer::Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00117c10;
  this->zeroth_order_statistics_ = 0;
  (this->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SymmetricMatrix::SymmetricMatrix(&this->second_order_statistics_,0);
  (this->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Buffer() : zeroth_order_statistics_(0) {
    }